

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Mapping.cpp
# Opt level: O1

int __thiscall axl::io::Mapping::open(Mapping *this,char *__file,int __oflag,...)

{
  int iVar1;
  uint64_t uVar2;
  void *pvVar3;
  void *pvVar4;
  size_t in_RCX;
  uint in_R8D;
  size_t offset;
  
  close(this,(int)__file);
  if (in_RCX == 0xffffffffffffffff) {
    uVar2 = psx::File::getSize((File *)__file);
    in_RCX = uVar2 - ___oflag;
  }
  if (g::getModule()::module == '\0') {
    iVar1 = __cxa_guard_acquire(&g::getModule()::module);
    if (iVar1 != 0) {
      g::Module::Module((Module *)g::getModule()::module);
      __cxa_atexit(g::Module::~Module,g::getModule()::module,&__dso_handle);
      __cxa_guard_release(&g::getModule()::module);
    }
  }
  pvVar4 = (void *)0x0;
  offset = ___oflag - ___oflag % (ulong)g::getModule()::module._16_8_;
  pvVar3 = psx::Mapping::map(&this->m_mapping,(void *)0x0,(in_RCX + ___oflag) - offset,
                             (uint)((in_R8D & 1) == 0) * 2 + 1,1,*(int *)__file,offset);
  if (pvVar3 != (void *)0x0) {
    pvVar4 = (void *)((long)pvVar3 + (___oflag - offset));
    this->m_p = pvVar4;
    this->m_size = in_RCX;
  }
  return (int)pvVar4;
}

Assistant:

void*
Mapping::open(
	File* file,
	uint64_t offset,
	size_t size,
	uint_t flags
) {
	close();

	if (size == -1)
		size = (size_t)(file->getSize() - offset);

	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	uint64_t viewBegin = offset - offset % systemInfo->m_mappingAlignFactor;
	uint64_t viewEnd = offset + size;

	void* p;

#if (_AXL_OS_WIN)
	uint_t protection = (flags & FileFlag_ReadOnly) ? PAGE_READONLY : PAGE_READWRITE;
	uint_t access = (flags & FileFlag_ReadOnly) ? FILE_MAP_READ : FILE_MAP_READ | FILE_MAP_WRITE;

	bool result = m_mapping.create(file->m_file, NULL, protection, viewEnd);
	if (!result)
		return NULL;

	p = m_view.view(m_mapping, access, viewBegin, (size_t)(viewEnd - viewBegin));
	if (!p) {
		m_mapping.close();
		return NULL;
	}
#elif (_AXL_OS_POSIX)
	int protection = (flags & FileFlag_ReadOnly) ? PROT_READ : PROT_READ | PROT_WRITE;

	p = m_mapping.map(NULL, viewEnd - viewBegin, protection, MAP_SHARED, file->m_file, viewBegin);
	if (!p)
		return NULL;
#endif

	m_p = (char*)p + offset - viewBegin;
	m_size = size;
	return m_p;
}